

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::TrackAllocCore
          (Recycler *this,void *object,size_t size,TrackAllocData *trackAllocData,bool traceLifetime
          )

{
  long *plVar1;
  int *piVar2;
  long *plVar3;
  type_info *ptVar4;
  ulong uVar5;
  code *pcVar6;
  long lVar7;
  bool bVar8;
  TrackerData *pTVar9;
  undefined4 *puVar10;
  TrackerItem *pTVar11;
  long lVar12;
  char16_t *form;
  ulong uVar13;
  ulong local_48;
  type_info *local_40;
  TrackerItem *local_38;
  TrackerItem *item;
  
  ptVar4 = trackAllocData->typeinfo;
  local_40 = ptVar4;
  if (DAT_0145c441 == '\x01') {
    TrackFree(this,(char *)object,size);
  }
  pTVar9 = GetTrackerData(this,object);
  if (pTVar9 != (TrackerData *)0x0) {
    pTVar9 = GetTrackerData(this,object);
    if (pTVar9 != &TrackerData::ExplicitFreeListObjectData) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1ffb,
                         "(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData)"
                         ,
                         "GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData"
                        );
      if (!bVar8) goto LAB_00689464;
      *puVar10 = 0;
    }
  }
  if (ptVar4 == (type_info *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ffc,"(typeInfo != nullptr)","typeInfo != nullptr");
    if (!bVar8) goto LAB_00689464;
    *puVar10 = 0;
  }
  uVar5 = trackAllocData->count;
  uVar13 = size - trackAllocData->plusSize;
  if (uVar5 == 0xffffffffffffffff) {
    local_48 = 1;
  }
  else {
    uVar13 = uVar13 / uVar5;
    local_48 = uVar5;
  }
  bVar8 = JsUtil::
          BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<std::type_info_const*>
                    ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->trackerDictionary,&local_40,&local_38);
  if (bVar8) {
    if ((local_38->instanceData).typeinfo != local_40) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2021,"(item->instanceData.typeinfo == typeInfo)",
                         "item->instanceData.typeinfo == typeInfo");
      if (!bVar8) goto LAB_00689464;
      *puVar10 = 0;
    }
    if ((local_38->instanceData).ItemSize != uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2022,"(item->instanceData.ItemSize == itemSize)",
                         "item->instanceData.ItemSize == itemSize");
      if (!bVar8) goto LAB_00689464;
      *puVar10 = 0;
    }
    if ((local_38->arrayData).ItemSize != uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2023,"(item->arrayData.ItemSize == itemSize)",
                         "item->arrayData.ItemSize == itemSize");
      if (!bVar8) {
LAB_00689464:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
    }
  }
  else {
    if ((uVar5 == 0xffffffffffffffff) || (DAT_0145c441 == '\0')) {
      pTVar11 = (TrackerItem *)
                NoCheckHeapAllocator::Alloc
                          ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x90);
      TrackerItem::TrackerItem(pTVar11,local_40);
      local_38 = pTVar11;
    }
    else {
      pTVar11 = (TrackerItem *)
                NoCheckHeapAllocator::Alloc
                          ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x110);
      TrackerItem::TrackerItem(pTVar11,local_40);
      local_38 = pTVar11;
      StackBackTrace::Capture((char *)(pTVar11 + 1),0x80,7);
    }
    (local_38->instanceData).ItemSize = uVar13;
    (local_38->arrayData).ItemSize = uVar13;
    JsUtil::
    BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->trackerDictionary,&local_40,&local_38);
  }
  lVar12 = 0x48;
  if (uVar5 == 0xffffffffffffffff) {
    lVar12 = 0;
  }
  plVar1 = (long *)((long)&(local_38->instanceData).ItemCount + lVar12);
  *plVar1 = *plVar1 + local_48;
  piVar2 = (int *)((long)&(local_38->instanceData).AllocCount + lVar12);
  *piVar2 = *piVar2 + 1;
  pTVar9 = (TrackerData *)((long)&(local_38->instanceData).typeinfo + lVar12);
  plVar1 = (long *)((long)&(local_38->instanceData).ReqSize + lVar12);
  lVar7 = plVar1[1];
  plVar3 = (long *)((long)&(local_38->instanceData).ReqSize + lVar12);
  *plVar3 = size + *plVar1;
  plVar3[1] = (size + 0xf & 0xfffffffffffffff0) + lVar7;
  (&(local_38->instanceData).TraceLifetime)[lVar12] = traceLifetime;
  if (traceLifetime) {
    form = L"Allocated %S %p\n";
    if (pTVar9->isArray != false) {
      form = L"Allocated %S[] %p\n";
    }
    Output::Print(form,*(char **)(pTVar9->typeinfo + 8) + (**(char **)(pTVar9->typeinfo + 8) == '*')
                  ,object);
  }
  SetTrackerData(this,object,pTVar9);
  return;
}

Assistant:

void
Recycler::TrackAllocCore(void * object, size_t size, const TrackAllocData& trackAllocData, bool traceLifetime)
{
    auto&& typeInfo = trackAllocData.GetTypeInfo();
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree((char*)object, size);
    }

    Assert(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData);
    Assert(typeInfo != nullptr);
    TrackerItem * item;
    size_t allocCount = trackAllocData.GetCount();
    size_t itemSize = (size - trackAllocData.GetPlusSize());
    bool isArray;
    if (allocCount != (size_t)-1)
    {
        isArray = true;
        itemSize = itemSize / allocCount;
    }
    else
    {
        isArray = false;
        allocCount = 1;
    }

    if (!trackerDictionary->TryGetValue(typeInfo, &item))
    {
#ifdef STACK_BACK_TRACE
        if (CONFIG_FLAG(KeepRecyclerTrackData) && isArray) // type info is not useful record stack instead
        {
            size_t stackTraceSize = 16 * sizeof(void*);
            item = NoCheckHeapNewPlus(stackTraceSize, TrackerItem, typeInfo);
            StackBackTrace::Capture((char*)&item[1], stackTraceSize, 7);
        }
        else
#endif
        {
            item = NoCheckHeapNew(TrackerItem, typeInfo);
        }

        item->instanceData.ItemSize = itemSize;
        item->arrayData.ItemSize = itemSize;
        trackerDictionary->Item(typeInfo, item);
    }
    else
    {
        Assert(item->instanceData.typeinfo == typeInfo);
        Assert(item->instanceData.ItemSize == itemSize);
        Assert(item->arrayData.ItemSize == itemSize);
    }
    TrackerData& data = (isArray)? item->arrayData : item->instanceData;
        data.ItemCount += allocCount;
        data.AllocCount++;
        data.ReqSize += size;
        data.AllocSize += HeapInfo::GetAlignedSizeNoCheck(size);
#ifdef TRACE_OBJECT_LIFETIME
    data.TraceLifetime = traceLifetime;

    if (traceLifetime)
    {
        Output::Print(data.isArray ? _u("Allocated %S[] %p\n") : _u("Allocated %S %p\n"), data.typeinfo->name(), object);
    }
#endif
#ifdef PERF_COUNTERS
    ++data.counter;
    data.sizeCounter += HeapInfo::GetAlignedSizeNoCheck(size);
#endif

    SetTrackerData(object, &data);
}